

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::AddCircle
          (ImDrawList *this,ImVec2 *center,float radius,ImU32 col,int num_segments,float thickness)

{
  uint uVar1;
  int in_ECX;
  uint in_EDX;
  undefined8 in_RSI;
  ImVec2 *in_RDI;
  float in_XMM0_Da;
  float fVar2;
  undefined4 in_XMM1_Da;
  float unaff_retaddr;
  float unaff_retaddr_00;
  ImVec2 *in_stack_00000008;
  float a_max;
  int radius_idx;
  undefined1 closed;
  ImU32 in_stack_ffffffffffffffdc;
  ImVec2 *pIVar3;
  
  if (((in_EDX & 0xff000000) != 0) && (0.0 < in_XMM0_Da)) {
    pIVar3 = in_RDI;
    if (in_ECX < 1) {
      in_stack_ffffffffffffffdc = (int)in_XMM0_Da - 1;
      if ((int)in_stack_ffffffffffffffdc < 0x40) {
        uVar1 = (uint)*(byte *)((long)in_RDI[7] + 0x90 + (long)(int)in_stack_ffffffffffffffdc);
      }
      else {
        fVar2 = acosf((in_XMM0_Da - *(float *)((long)in_RDI[7] + 0x18)) / in_XMM0_Da);
        uVar1 = ImClamp<int>((int)(6.2831855 / fVar2),0xc,0x200);
      }
      fVar2 = (float)((ulong)in_RDI >> 0x20);
    }
    else {
      uVar1 = ImClamp<int>(in_ECX,3,0x200);
      fVar2 = (float)((ulong)in_RDI >> 0x20);
    }
    closed = (undefined1)
             ((uint)((((float)(int)uVar1 - 1.0) * 6.2831855) / (float)(int)uVar1) >> 0x18);
    if (uVar1 == 0xc) {
      PathArcToFast((ImDrawList *)CONCAT44(unaff_retaddr_00,unaff_retaddr),pIVar3,
                    (float)((ulong)in_RSI >> 0x20),(int)in_RSI,(int)in_XMM0_Da);
    }
    else {
      PathArcTo(_a_max,in_stack_00000008,unaff_retaddr_00,unaff_retaddr,
                (float)((ulong)pIVar3 >> 0x20),(int)pIVar3);
    }
    PathStroke((ImDrawList *)CONCAT44(uVar1,in_XMM1_Da),in_stack_ffffffffffffffdc,(bool)closed,fVar2
              );
  }
  return;
}

Assistant:

void ImDrawList::AddCircle(const ImVec2& center, float radius, ImU32 col, int num_segments, float thickness)
{
    if ((col & IM_COL32_A_MASK) == 0 || radius <= 0.0f)
        return;

    // Obtain segment count
    if (num_segments <= 0)
    {
        // Automatic segment count
        const int radius_idx = (int)radius - 1;
        if (radius_idx < IM_ARRAYSIZE(_Data->CircleSegmentCounts))
            num_segments = _Data->CircleSegmentCounts[radius_idx]; // Use cached value
        else
            num_segments = IM_DRAWLIST_CIRCLE_AUTO_SEGMENT_CALC(radius, _Data->CircleSegmentMaxError);
    }
    else
    {
        // Explicit segment count (still clamp to avoid drawing insanely tessellated shapes)
        num_segments = ImClamp(num_segments, 3, IM_DRAWLIST_CIRCLE_AUTO_SEGMENT_MAX);
    }

    // Because we are filling a closed shape we remove 1 from the count of segments/points
    const float a_max = (IM_PI * 2.0f) * ((float)num_segments - 1.0f) / (float)num_segments;
    if (num_segments == 12)
        PathArcToFast(center, radius - 0.5f, 0, 12 - 1);
    else
        PathArcTo(center, radius - 0.5f, 0.0f, a_max, num_segments - 1);
    PathStroke(col, true, thickness);
}